

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O1

double units::precise::equations::convert_value_to_equnit(double val,unit_data *UT)

{
  unit_data uVar1;
  undefined *puVar2;
  uint uVar3;
  double dVar4;
  double __z;
  double local_18;
  
  uVar1 = *UT;
  if (-1 < (int)uVar1) {
    return val;
  }
  if (val <= 0.0 && ((uint)uVar1 & 0xe00000) == 0) {
    return NAN;
  }
  uVar3 = (uint)uVar1 & 0xc000000;
  switch(((uint)uVar1 >> 0x1e & 1 | (uint)uVar1 >> 0x1a & 4 | (uint)uVar1 >> 0x1c & 2) +
         (uint)(uVar3 != 0) * 8 | (uint)(((uint)uVar1 & 0xe00000) != 0) << 4) {
  case 0:
  case 10:
    dVar4 = log10(val);
    return dVar4;
  case 1:
    if (((uint)uVar1 & 0xfffffff) == 0x1d2) {
      local_18 = 0.5;
    }
    else {
      local_18 = *(double *)(&DAT_0013f410 + (ulong)(uVar3 == 0x8000000) * 8);
    }
    dVar4 = log(val);
    goto LAB_0010efe7;
  case 2:
    if (((uint)uVar1 & 0xfffffff) == 0x1d2) {
      local_18 = 1.0;
    }
    else {
      puVar2 = &DAT_0013f400;
LAB_0010ee9b:
      local_18 = *(double *)(puVar2 + (ulong)(uVar3 == 0x8000000) * 8);
    }
    goto LAB_0010efdd;
  case 3:
    if (((uint)uVar1 & 0xfffffff) != 0x1d2) {
      puVar2 = &DAT_0013f3f0;
      goto LAB_0010ee9b;
    }
    local_18 = 10.0;
LAB_0010efdd:
    dVar4 = log10(val);
LAB_0010efe7:
    val = dVar4 * local_18;
    break;
  case 4:
    dVar4 = log10(val);
    val = -dVar4;
    break;
  case 5:
    dVar4 = log10(val);
    val = dVar4 * -0.5;
    break;
  case 6:
    dVar4 = log10(val);
    val = dVar4 / -3.0;
    break;
  case 7:
    dVar4 = log10(val);
    val = dVar4 / -4.698970004336019;
    break;
  case 8:
    dVar4 = log2(val);
    return dVar4;
  case 9:
    dVar4 = log(val);
    return dVar4;
  case 0xb:
    dVar4 = log10(val);
    val = dVar4 * 10.0;
    break;
  case 0xc:
    dVar4 = log10(val);
    val = dVar4 + dVar4;
    break;
  case 0xd:
    dVar4 = log10(val);
    val = dVar4 * 20.0;
    break;
  case 0xe:
    dVar4 = log10(val);
    val = dVar4 / 0.47712125471966244;
    break;
  case 0xf:
    dVar4 = log(val);
    val = dVar4 * 0.5;
    break;
  case 0x10:
    val = 141.5 / val + -131.5;
    break;
  case 0x11:
    val = 140.0 / val + -130.0;
    break;
  case 0x12:
    val = (1.0 - 1.0 / val) * 145.0;
    break;
  case 0x16:
    dVar4 = fma(val,1.75748569529e-10,-9.09204303833e-08);
    dVar4 = fma(dVar4,val,1.5227445578e-05);
    dVar4 = fma(dVar4,val,-0.000773787973277);
    dVar4 = fma(dVar4,val,0.0281978682167);
    __z = -0.667563481438;
    goto LAB_0010efaa;
  case 0x17:
    dVar4 = fma(val,2.18882896425e-08,-4.78236313769e-06);
    dVar4 = fma(dVar4,val,0.000391121840061);
    dVar4 = fma(dVar4,val,-0.0152427367162);
    dVar4 = fma(dVar4,val,0.424089585061);
    __z = 0.49924168937;
LAB_0010efaa:
    dVar4 = fma(dVar4,val,__z);
    return dVar4;
  case 0x18:
    dVar4 = pow(val / 14.1,0.6666666666666666);
    val = dVar4 + -2.0;
    break;
  case 0x1b:
    dVar4 = tan(val);
    val = dVar4 * 100.0;
    break;
  case 0x1d:
    dVar4 = log10(val);
    val = dVar4 * 0.6666666666666666 + -10.7;
    break;
  case 0x1e:
    dVar4 = log10(val);
    val = dVar4 * 0.6666666666666666 + -3.2;
  }
  return val;
}

Assistant:

inline double
            convert_value_to_equnit(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            if ((logtype < 16) && (val <= 0.0)) {
                return constants::invalid_conversion;
            }

            switch (logtype) {
                case 0:
                case 10:
                    return std::log10(val);
                case 1:
                    return ((is_power_unit(UT)) ? 0.5 : 1.0) * (std::log)(val);
                case 2:
                    return ((is_power_unit(UT)) ? 1.0 : 2.0) * std::log10(val);
                case 3:
                    return ((is_power_unit(UT)) ? 10.0 : 20.0) *
                        std::log10(val);
                case 4:
                    return -std::log10(val);
                case 5:
                    return -std::log10(val) / 2.0;
                case 6:
                    return -std::log10(val) / 3.0;
                case 7:
                    return -std::log10(val) / std::log10(50000);
                case 8:
                    return (std::log2)(val);
                case 9:
                    return (std::log)(val);
                case 11:
                    return 10.0 * std::log10(val);
                case 12:
                    return 2.0 * std::log10(val);
                case 13:
                    return 20.0 * std::log10(val);
                case 14:
                    return std::log10(val) / std::log10(3);
                case 15:
                    return 0.5 * (std::log)(val);
                case 16:  // API Gravity
                    return 141.5 / (val)-131.5;
                case 17:  // degree Baume Light
                    return 140.0 / val - 130;
                case 18:  // degree Baume Heavy
                    return 145.0 * (1.0 - 1.0 / val);
                case 22:  // saffir simpson hurricane scale from wind speed
                {  // using horners method on polynomial approximation of
                   // saffir-simpson wind speed scale
                    double out = 1.75748569529e-10;
                    out = std::fma(out, val, -9.09204303833e-08);
                    out = std::fma(out, val, 1.52274455780e-05);
                    out = std::fma(out, val, -7.73787973277e-04);
                    out = std::fma(out, val, 2.81978682167e-02);
                    out = std::fma(out, val, -6.67563481438e-01);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 2.18882896425e-08;
                    out = std::fma(out, val, -4.78236313769e-06);
                    out = std::fma(out, val, 3.91121840061e-04);
                    out = std::fma(out, val, -1.52427367162e-02);
                    out = std::fma(out, val, 4.24089585061e-01);
                    out = std::fma(out, val, 4.99241689370e-01);
                    return out;
                }
                case 24:  // fujita scale
                    return std::pow(val / 14.1, 2.0 / 3.0) - 2.0;
                case 27:  // prism diopter
                    return 100.0 * std::tan(val);
                case 29:  // moment magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 10.7;
                case 30:  // energy magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 3.2;
                default:
                    return val;
            }
        }